

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool __thiscall units::precise_unit::operator==(precise_unit *this,precise_unit *other)

{
  double val1;
  double val2;
  bool bVar1;
  
  if ((other->base_units_ != this->base_units_) || (this->commodity_ != other->commodity_)) {
    return false;
  }
  val1 = this->multiplier_;
  val2 = other->multiplier_;
  if ((val1 == val2) && (!NAN(val1) && !NAN(val2))) {
    return true;
  }
  bVar1 = detail::compare_round_equals_precise(val1,val2);
  return bVar1;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }